

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void replay_read_newgame(unsigned_long_long *init,int *playmode,char *namebuf,int *initrole,
                        int *initrace,int *initgend,int *initalign)

{
  int iVar1;
  char *pcVar2;
  uint local_5c;
  int local_58;
  uint seed;
  int n;
  int ver3;
  int ver2;
  int ver1;
  char *verstr;
  char *header;
  int *initgend_local;
  int *initrace_local;
  int *initrole_local;
  char *namebuf_local;
  int *playmode_local;
  unsigned_long_long *init_local;
  
  header = (char *)initgend;
  initgend_local = initrace;
  initrace_local = initrole;
  initrole_local = (int *)namebuf;
  namebuf_local = (char *)playmode;
  playmode_local = (int *)init;
  verstr = next_log_token();
  if (verstr != (char *)0x0) {
    iVar1 = strcmp(verstr,"NHGAME");
    if (iVar1 == 0) {
      next_log_token();
      next_log_token();
      next_log_token();
      _ver2 = next_log_token();
      local_58 = __isoc99_sscanf(_ver2,"%d.%d.%d",&ver3,&n,&seed);
      if (local_58 != 3) {
        parse_error("No version found where it was expected");
      }
      if ((ver3 != 0) && (n != 0)) {
        raw_printf("Warning: Version mismatch; expected %d.%d, got %d.%d\n",0,0,(ulong)(uint)ver3,
                   (ulong)(uint)n);
      }
      pcVar2 = next_log_token();
      sscan_llx(pcVar2,(unsigned_long_long *)playmode_local);
      pcVar2 = next_log_token();
      __isoc99_sscanf(pcVar2,"%x",&local_5c);
      pcVar2 = next_log_token();
      iVar1 = atoi(pcVar2);
      *(int *)namebuf_local = iVar1;
      pcVar2 = next_log_token();
      base64_decode(pcVar2,(char *)initrole_local);
      pcVar2 = next_log_token();
      iVar1 = str2role(pcVar2);
      *initrace_local = iVar1;
      pcVar2 = next_log_token();
      iVar1 = str2race(pcVar2);
      *initgend_local = iVar1;
      pcVar2 = next_log_token();
      iVar1 = str2gend(pcVar2);
      *(int *)header = iVar1;
      pcVar2 = next_log_token();
      iVar1 = str2align(pcVar2);
      *initalign = iVar1;
      if ((((*initrace_local != -1) && (*initgend_local != -1)) && (*(int *)header != -1)) &&
         (*initalign != -1)) {
        mt_srand(local_5c);
        replay_read_commandlist();
        return;
      }
      terminate();
    }
  }
  parse_error("This file does not look like a valid logfile.");
}

Assistant:

void replay_read_newgame(unsigned long long *init, int *playmode, char *namebuf,
			 int *initrole, int *initrace, int *initgend, int *initalign)
{
    char *header, *verstr;
    int ver1, ver2, ver3, n;
    unsigned int seed;
    
    header = next_log_token();
    if (!header || strcmp(header, "NHGAME"))
	parse_error("This file does not look like a valid logfile.");
    /* now header is not read any more */

    next_log_token(); /* marker */
    next_log_token(); /* end pos, see replay_begin() */
    next_log_token(); /* action count, see replay_begin() */
    verstr = next_log_token();
    
    n = sscanf(verstr, "%d.%d.%d", &ver1, &ver2, &ver3);
    if (n != 3)
	parse_error("No version found where it was expected");
    /* now verstr is not read any more */

    if (ver1 != VERSION_MAJOR && ver2 != VERSION_MINOR)
	raw_printf("Warning: Version mismatch; expected %d.%d, got %d.%d\n",
		   VERSION_MAJOR, VERSION_MINOR, ver1, ver2);

    sscan_llx(next_log_token(), init);
    sscanf(next_log_token(), "%x", &seed);
    *playmode = atoi(next_log_token());
    base64_decode(next_log_token(), namebuf);
    *initrole = str2role(next_log_token());
    *initrace = str2race(next_log_token());
    *initgend = str2gend(next_log_token());
    *initalign = str2align(next_log_token());

    if (*initrole == ROLE_NONE || *initrace == ROLE_NONE ||
	*initgend == ROLE_NONE || *initalign == ROLE_NONE)
	terminate();
    
    mt_srand(seed);
    
    replay_read_commandlist();
}